

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_life_tokens.hpp
# Opt level: O2

void __thiscall
wigwag::life_assurance::intrusive_life_tokens::life_assurance::release_life_assurance
          (life_assurance *this,shared_data *sd)

{
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> uStack_28;
  
  LOCK();
  (this->_lock_counter_and_alive_flag).super___atomic_base<unsigned_int>._M_i =
       (this->_lock_counter_and_alive_flag).super___atomic_base<unsigned_int>._M_i + 0x80000000;
  UNLOCK();
  std::unique_lock<std::mutex>::unique_lock(&uStack_28,&sd->_mutex);
  while ((this->_lock_counter_and_alive_flag).super___atomic_base<unsigned_int>._M_i != 0) {
    std::condition_variable::wait((unique_lock *)sd);
  }
  std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
  return;
}

Assistant:

void release_life_assurance(const shared_data& sd)
            {
                _lock_counter_and_alive_flag -= alive_flag;
                std::unique_lock<std::mutex> l(sd._mutex);
                while (_lock_counter_and_alive_flag != 0)
                    sd._cond_var.wait(l);
            }